

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O0

void __thiscall
alex::LinearModelBuilder<int>::LinearModelBuilder
          (LinearModelBuilder<int> *this,LinearModel<int> *model)

{
  longdouble lVar1;
  int iVar2;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  double dVar3;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 0;
  lVar1 = (longdouble)0;
  *(longdouble *)(in_RDI + 2) = lVar1;
  *(longdouble *)(in_RDI + 4) = lVar1;
  *(longdouble *)(in_RDI + 6) = lVar1;
  *(longdouble *)(in_RDI + 8) = lVar1;
  iVar2 = std::numeric_limits<int>::max();
  *(int *)(in_RDI + 10) = iVar2;
  iVar2 = std::numeric_limits<int>::lowest();
  *(int *)((long)in_RDI + 0x54) = iVar2;
  dVar3 = std::numeric_limits<double>::max();
  in_RDI[0xb] = dVar3;
  dVar3 = std::numeric_limits<double>::lowest();
  in_RDI[0xc] = dVar3;
  return;
}

Assistant:

explicit LinearModelBuilder<T>(LinearModel<T>* model) : model_(model) {}